

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>
::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_>::on_dec
          (int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  ulong uVar1;
  long lVar2;
  dec_writer f;
  uint uVar3;
  int num_digits;
  string_view prefix;
  undefined4 uStack_4;
  
  uVar1 = this->abs_value;
  lVar2 = 0x3f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar3 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  num_digits = (uVar3 + 1) -
               (uint)(uVar1 < *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 +
                                        (ulong)uVar3 * 8));
  f._12_4_ = uStack_4;
  f.num_digits = num_digits;
  f.abs_value = uVar1;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::dec_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
              *)this->writer,num_digits,prefix,this->spec,f);
  return;
}

Assistant:

void on_dec() {
      int num_digits = internal::count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), spec,
                       dec_writer{abs_value, num_digits});
    }